

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sg_striped_sse41_128_32.c
# Opt level: O1

parasail_result_t *
parasail_sg_flags_rowcol_striped_profile_sse41_128_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap,int s1_beg,int s1_end,
          int s2_beg,int s2_end)

{
  int *piVar1;
  uint *puVar2;
  undefined4 *puVar3;
  void *pvVar4;
  parasail_matrix_t *ppVar5;
  undefined1 auVar6 [16];
  undefined4 uVar7;
  undefined4 uVar8;
  undefined4 uVar9;
  int iVar10;
  int iVar11;
  uint uVar12;
  parasail_result_t *ppVar13;
  __m128i *palVar14;
  __m128i *ptr;
  __m128i *ptr_00;
  int32_t *ptr_01;
  uint uVar15;
  ulong uVar16;
  int iVar17;
  uint uVar18;
  uint uVar19;
  ulong uVar20;
  ulong uVar21;
  uint uVar22;
  ulong uVar23;
  int iVar24;
  int32_t iVar25;
  ulong uVar26;
  int iVar27;
  int iVar28;
  ulong uVar29;
  long lVar30;
  __m128i *ptr_02;
  __m128i *palVar31;
  uint uVar32;
  uint uVar33;
  long lVar34;
  bool bVar35;
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  uint uVar41;
  uint uVar42;
  uint uVar43;
  uint uVar44;
  int iVar45;
  int iVar46;
  int iVar50;
  int iVar51;
  int iVar52;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  int iVar53;
  int iVar56;
  int iVar57;
  uint uVar58;
  undefined1 auVar54 [16];
  __m128i alVar55;
  int iVar59;
  int iVar62;
  int iVar63;
  int iVar64;
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  uint uVar65;
  uint uVar66;
  uint uVar67;
  uint uVar68;
  __m128i_32_t e;
  __m128i_32_t h;
  int local_dc;
  longlong local_58;
  longlong lStack_50;
  longlong local_48;
  longlong lStack_40;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_8();
  }
  else {
    pvVar4 = (profile->profile32).score;
    if (pvVar4 == (void *)0x0) {
      parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_7();
    }
    else {
      ppVar5 = profile->matrix;
      if (ppVar5 == (parasail_matrix_t *)0x0) {
        parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_6();
      }
      else {
        uVar19 = profile->s1Len;
        if ((int)uVar19 < 1) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_3();
        }
        else if (open < 0) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sg_flags_rowcol_striped_profile_sse41_128_32_cold_1();
        }
        else {
          iVar10 = uVar19 - 1;
          uVar26 = (ulong)uVar19 + 3;
          uVar23 = uVar26 >> 2;
          uVar15 = (uint)uVar23;
          iVar11 = iVar10 / (int)uVar15;
          uVar32 = iVar10 % (int)uVar15;
          iVar24 = -open;
          iVar27 = ppVar5->min;
          uVar33 = 0x80000000 - iVar27;
          if (iVar27 != iVar24 && SBORROW4(iVar27,iVar24) == iVar27 + open < 0) {
            uVar33 = open | 0x80000000;
          }
          uVar12 = 0x7ffffffe - ppVar5->max;
          ppVar13 = parasail_result_new_rowcol1((uint)uVar26 & 0x7ffffffc,s2Len);
          if (ppVar13 != (parasail_result_t *)0x0) {
            ppVar13->flag =
                 (uint)(s1_end != 0) * 0x10 + (uint)(s1_beg != 0) * 8 | (uint)(s2_beg != 0) << 0xe |
                 (uint)(s2_end != 0) << 0xf | ppVar13->flag | 0x4440802;
            palVar14 = parasail_memalign___m128i(0x10,uVar23);
            ptr = parasail_memalign___m128i(0x10,uVar23);
            ptr_00 = parasail_memalign___m128i(0x10,uVar23);
            ptr_01 = parasail_memalign_int32_t(0x10,(ulong)(s2Len + 1));
            uVar16 = 0;
            if ((ptr_01 != (int32_t *)0x0 && ptr_00 != (__m128i *)0x0) &&
                (ptr != (__m128i *)0x0 && palVar14 != (__m128i *)0x0)) {
              iVar17 = s2Len + -1;
              uVar18 = 3 - iVar11;
              uVar33 = uVar33 + 1;
              auVar36._4_4_ = uVar33;
              auVar36._0_4_ = uVar33;
              auVar36._8_4_ = uVar33;
              auVar36._12_4_ = uVar33;
              iVar27 = iVar24;
              do {
                lVar30 = 0;
                iVar28 = iVar27;
                do {
                  iVar56 = 0;
                  if (s1_beg == 0) {
                    iVar56 = iVar28;
                  }
                  *(int *)((long)&local_48 + lVar30 * 4) = iVar56;
                  lVar34 = (long)iVar56 - (ulong)(uint)open;
                  if (lVar34 < -0x7fffffff) {
                    lVar34 = -0x80000000;
                  }
                  *(int *)((long)&local_58 + lVar30 * 4) = (int)lVar34;
                  lVar30 = lVar30 + 1;
                  iVar28 = iVar28 - gap * uVar15;
                } while (lVar30 != 4);
                palVar14[uVar16][0] = local_48;
                palVar14[uVar16][1] = lStack_40;
                ptr_00[uVar16][0] = local_58;
                ptr_00[uVar16][1] = lStack_50;
                uVar16 = uVar16 + 1;
                iVar27 = iVar27 - gap;
              } while (uVar16 != uVar23);
              *ptr_01 = 0;
              uVar16 = 1;
              iVar27 = iVar24;
              do {
                iVar25 = 0;
                if (s2_beg == 0) {
                  iVar25 = iVar27;
                }
                ptr_01[uVar16] = iVar25;
                uVar16 = uVar16 + 1;
                iVar27 = iVar27 - gap;
              } while (s2Len + 1 != uVar16);
              uVar16 = (ulong)(uVar15 + (uVar15 == 0));
              uVar22 = 1;
              if (1 < (int)uVar18) {
                uVar22 = uVar18;
              }
              uVar20 = 1;
              if (1 < s2Len) {
                uVar20 = (ulong)(uint)s2Len;
              }
              uVar21 = 0;
              auVar39 = auVar36;
              auVar48 = auVar36;
              iVar27 = gap;
              uVar41 = uVar12;
              uVar42 = uVar12;
              uVar43 = uVar12;
              uVar44 = uVar12;
              local_dc = iVar17;
              do {
                ptr_02 = ptr;
                ptr = palVar14;
                iVar45 = ppVar5->mapper[(byte)s2[uVar21]];
                palVar14 = ptr + (uVar15 - 1);
                iVar28 = (int)(*palVar14)[0];
                iVar56 = *(int *)((long)*palVar14 + 4);
                iVar57 = (int)(*palVar14)[1];
                iVar25 = ptr_01[uVar21];
                lVar30 = 0;
                auVar47 = auVar36;
                do {
                  piVar1 = (int *)((long)pvVar4 + lVar30 + uVar23 * (long)iVar45 * 0x10);
                  iVar53 = iVar25 + *piVar1;
                  iVar28 = iVar28 + piVar1[1];
                  iVar56 = iVar56 + piVar1[2];
                  iVar57 = iVar57 + piVar1[3];
                  piVar1 = (int *)((long)*ptr_00 + lVar30);
                  iVar59 = *piVar1;
                  iVar62 = piVar1[1];
                  iVar63 = piVar1[2];
                  iVar64 = piVar1[3];
                  iVar46 = auVar47._0_4_;
                  uVar65 = (uint)(iVar59 < iVar46) * iVar46 | (uint)(iVar59 >= iVar46) * iVar59;
                  iVar50 = auVar47._4_4_;
                  uVar66 = (uint)(iVar62 < iVar50) * iVar50 | (uint)(iVar62 >= iVar50) * iVar62;
                  iVar51 = auVar47._8_4_;
                  uVar67 = (uint)(iVar63 < iVar51) * iVar51 | (uint)(iVar63 >= iVar51) * iVar63;
                  iVar52 = auVar47._12_4_;
                  uVar68 = (uint)(iVar64 < iVar52) * iVar52 | (uint)(iVar64 >= iVar52) * iVar64;
                  uVar65 = (uint)((int)uVar65 < iVar53) * iVar53 | ((int)uVar65 >= iVar53) * uVar65;
                  uVar66 = (uint)((int)uVar66 < iVar28) * iVar28 | ((int)uVar66 >= iVar28) * uVar66;
                  uVar67 = (uint)((int)uVar67 < iVar56) * iVar56 | ((int)uVar67 >= iVar56) * uVar67;
                  uVar68 = (uint)((int)uVar68 < iVar57) * iVar57 | ((int)uVar68 >= iVar57) * uVar68;
                  puVar2 = (uint *)((long)*ptr_02 + lVar30);
                  *puVar2 = uVar65;
                  puVar2[1] = uVar66;
                  puVar2[2] = uVar67;
                  puVar2[3] = uVar68;
                  iVar28 = auVar39._0_4_;
                  auVar38._0_4_ =
                       (iVar28 < (int)uVar65) * uVar65 | (uint)(iVar28 >= (int)uVar65) * iVar28;
                  iVar28 = auVar39._4_4_;
                  auVar38._4_4_ =
                       (iVar28 < (int)uVar66) * uVar66 | (uint)(iVar28 >= (int)uVar66) * iVar28;
                  iVar28 = auVar39._8_4_;
                  iVar56 = auVar39._12_4_;
                  auVar38._8_4_ =
                       (iVar28 < (int)uVar67) * uVar67 | (uint)(iVar28 >= (int)uVar67) * iVar28;
                  auVar38._12_4_ =
                       (iVar56 < (int)uVar68) * uVar68 | (uint)(iVar56 >= (int)uVar68) * iVar56;
                  uVar41 = (uint)(iVar59 < (int)uVar41) * iVar59 | (iVar59 >= (int)uVar41) * uVar41;
                  uVar42 = (uint)(iVar62 < (int)uVar42) * iVar62 | (iVar62 >= (int)uVar42) * uVar42;
                  uVar43 = (uint)(iVar63 < (int)uVar43) * iVar63 | (iVar63 >= (int)uVar43) * uVar43;
                  uVar44 = (uint)(iVar64 < (int)uVar44) * iVar64 | (iVar64 >= (int)uVar44) * uVar44;
                  uVar41 = (uint)(iVar46 < (int)uVar41) * iVar46 | (iVar46 >= (int)uVar41) * uVar41;
                  uVar42 = (uint)(iVar50 < (int)uVar42) * iVar50 | (iVar50 >= (int)uVar42) * uVar42;
                  uVar43 = (uint)(iVar51 < (int)uVar43) * iVar51 | (iVar51 >= (int)uVar43) * uVar43;
                  uVar44 = (uint)(iVar52 < (int)uVar44) * iVar52 | (iVar52 >= (int)uVar44) * uVar44;
                  uVar41 = ((int)uVar65 < (int)uVar41) * uVar65 |
                           ((int)uVar65 >= (int)uVar41) * uVar41;
                  uVar42 = ((int)uVar66 < (int)uVar42) * uVar66 |
                           ((int)uVar66 >= (int)uVar42) * uVar42;
                  uVar43 = ((int)uVar67 < (int)uVar43) * uVar67 |
                           ((int)uVar67 >= (int)uVar43) * uVar43;
                  uVar44 = ((int)uVar68 < (int)uVar44) * uVar68 |
                           ((int)uVar68 >= (int)uVar44) * uVar44;
                  iVar28 = uVar65 - open;
                  iVar56 = uVar66 - open;
                  iVar57 = uVar67 - open;
                  iVar53 = uVar68 - open;
                  iVar59 = iVar59 - gap;
                  iVar62 = iVar62 - gap;
                  iVar63 = iVar63 - gap;
                  iVar64 = iVar64 - gap;
                  puVar2 = (uint *)((long)*ptr_00 + lVar30);
                  *puVar2 = (uint)(iVar59 < iVar28) * iVar28 | (uint)(iVar59 >= iVar28) * iVar59;
                  puVar2[1] = (uint)(iVar62 < iVar56) * iVar56 | (uint)(iVar62 >= iVar56) * iVar62;
                  puVar2[2] = (uint)(iVar63 < iVar57) * iVar57 | (uint)(iVar63 >= iVar57) * iVar63;
                  puVar2[3] = (uint)(iVar64 < iVar53) * iVar53 | (uint)(iVar64 >= iVar53) * iVar64;
                  iVar46 = iVar46 - gap;
                  iVar50 = iVar50 - gap;
                  iVar51 = iVar51 - gap;
                  iVar52 = iVar52 - gap;
                  auVar47._0_4_ =
                       (uint)(iVar46 < iVar28) * iVar28 | (uint)(iVar46 >= iVar28) * iVar46;
                  auVar47._4_4_ =
                       (uint)(iVar50 < iVar56) * iVar56 | (uint)(iVar50 >= iVar56) * iVar50;
                  auVar47._8_4_ =
                       (uint)(iVar51 < iVar57) * iVar57 | (uint)(iVar51 >= iVar57) * iVar51;
                  auVar47._12_4_ =
                       (uint)(iVar52 < iVar53) * iVar53 | (uint)(iVar52 >= iVar53) * iVar52;
                  piVar1 = (int *)((long)*ptr + lVar30);
                  iVar25 = *piVar1;
                  iVar28 = piVar1[1];
                  iVar56 = piVar1[2];
                  iVar57 = piVar1[3];
                  lVar30 = lVar30 + 0x10;
                  auVar39 = auVar38;
                } while (uVar16 << 4 != lVar30);
                uVar65 = 0;
                do {
                  iVar28 = iVar24;
                  if (s2_beg == 0) {
                    iVar28 = ptr_01[uVar21 + 1] - open;
                  }
                  iVar50 = auVar47._0_4_;
                  iVar51 = auVar47._4_4_;
                  iVar52 = auVar47._8_4_;
                  iVar56 = (int)(*ptr_02)[0];
                  iVar57 = *(int *)((long)*ptr_02 + 4);
                  iVar45 = (int)(*ptr_02)[1];
                  iVar46 = *(int *)((long)*ptr_02 + 0xc);
                  uVar66 = (uint)(iVar56 < iVar28) * iVar28 | (uint)(iVar56 >= iVar28) * iVar56;
                  uVar67 = (uint)(iVar57 < iVar50) * iVar50 | (uint)(iVar57 >= iVar50) * iVar57;
                  uVar68 = (uint)(iVar45 < iVar51) * iVar51 | (uint)(iVar45 >= iVar51) * iVar45;
                  uVar58 = (uint)(iVar46 < iVar52) * iVar52 | (uint)(iVar46 >= iVar52) * iVar46;
                  *(uint *)*ptr_02 = uVar66;
                  *(uint *)((long)*ptr_02 + 4) = uVar67;
                  *(uint *)(*ptr_02 + 1) = uVar68;
                  *(uint *)((long)*ptr_02 + 0xc) = uVar58;
                  uVar41 = ((int)uVar66 < (int)uVar41) * uVar66 |
                           ((int)uVar66 >= (int)uVar41) * uVar41;
                  uVar42 = ((int)uVar67 < (int)uVar42) * uVar67 |
                           ((int)uVar67 >= (int)uVar42) * uVar42;
                  uVar43 = ((int)uVar68 < (int)uVar43) * uVar68 |
                           ((int)uVar68 >= (int)uVar43) * uVar43;
                  uVar44 = ((int)uVar58 < (int)uVar44) * uVar58 |
                           ((int)uVar58 >= (int)uVar44) * uVar44;
                  iVar56 = auVar38._0_4_;
                  auVar39._0_4_ =
                       (iVar56 < (int)uVar66) * uVar66 | (uint)(iVar56 >= (int)uVar66) * iVar56;
                  iVar56 = auVar38._4_4_;
                  auVar39._4_4_ =
                       (iVar56 < (int)uVar67) * uVar67 | (uint)(iVar56 >= (int)uVar67) * iVar56;
                  iVar56 = auVar38._8_4_;
                  iVar57 = auVar38._12_4_;
                  auVar39._8_4_ =
                       (iVar56 < (int)uVar68) * uVar68 | (uint)(iVar56 >= (int)uVar68) * iVar56;
                  auVar39._12_4_ =
                       (iVar57 < (int)uVar58) * uVar58 | (uint)(iVar57 >= (int)uVar58) * iVar57;
                  auVar47._0_4_ = iVar28 - gap;
                  auVar47._4_4_ = iVar50 - gap;
                  auVar47._8_4_ = iVar51 - gap;
                  auVar47._12_4_ = iVar52 - gap;
                  auVar60._0_4_ = -(uint)((int)(uVar66 - open) < (int)auVar47._0_4_);
                  auVar60._4_4_ = -(uint)((int)(uVar67 - open) < (int)auVar47._4_4_);
                  auVar60._8_4_ = -(uint)((int)(uVar68 - open) < (int)auVar47._8_4_);
                  auVar60._12_4_ = -(uint)((int)(uVar58 - open) < (int)auVar47._12_4_);
                  iVar28 = movmskps(iVar28,auVar60);
                  if (iVar28 == 0) {
                    bVar35 = true;
                  }
                  else {
                    alVar55[1] = 1;
                    auVar38 = auVar39;
                    palVar14 = ptr_02;
                    do {
                      uVar29 = alVar55[1];
                      palVar31 = palVar14 + 1;
                      auVar39 = auVar38;
                      if (uVar16 == uVar29) break;
                      iVar56 = (int)(*palVar31)[0];
                      iVar57 = *(int *)((long)palVar14[1] + 4);
                      iVar45 = (int)palVar14[1][1];
                      iVar46 = *(int *)((long)palVar14[1] + 0xc);
                      iVar28 = auVar47._0_4_;
                      uVar66 = (uint)(iVar56 < iVar28) * iVar28 | (uint)(iVar56 >= iVar28) * iVar56;
                      iVar56 = auVar47._4_4_;
                      uVar67 = (uint)(iVar57 < iVar56) * iVar56 | (uint)(iVar57 >= iVar56) * iVar57;
                      iVar57 = auVar47._8_4_;
                      uVar68 = (uint)(iVar45 < iVar57) * iVar57 | (uint)(iVar45 >= iVar57) * iVar45;
                      iVar45 = auVar47._12_4_;
                      uVar58 = (uint)(iVar46 < iVar45) * iVar45 | (uint)(iVar46 >= iVar45) * iVar46;
                      *(uint *)*palVar31 = uVar66;
                      *(uint *)((long)palVar14[1] + 4) = uVar67;
                      *(uint *)(palVar14[1] + 1) = uVar68;
                      *(uint *)((long)palVar14[1] + 0xc) = uVar58;
                      uVar41 = ((int)uVar66 < (int)uVar41) * uVar66 |
                               ((int)uVar66 >= (int)uVar41) * uVar41;
                      uVar42 = ((int)uVar67 < (int)uVar42) * uVar67 |
                               ((int)uVar67 >= (int)uVar42) * uVar42;
                      uVar43 = ((int)uVar68 < (int)uVar43) * uVar68 |
                               ((int)uVar68 >= (int)uVar43) * uVar43;
                      uVar44 = ((int)uVar58 < (int)uVar44) * uVar58 |
                               ((int)uVar58 >= (int)uVar44) * uVar44;
                      iVar46 = auVar38._0_4_;
                      auVar39._0_4_ =
                           (iVar46 < (int)uVar66) * uVar66 | (uint)(iVar46 >= (int)uVar66) * iVar46;
                      iVar46 = auVar38._4_4_;
                      auVar39._4_4_ =
                           (iVar46 < (int)uVar67) * uVar67 | (uint)(iVar46 >= (int)uVar67) * iVar46;
                      iVar46 = auVar38._8_4_;
                      iVar50 = auVar38._12_4_;
                      auVar39._8_4_ =
                           (iVar46 < (int)uVar68) * uVar68 | (uint)(iVar46 >= (int)uVar68) * iVar46;
                      auVar39._12_4_ =
                           (iVar50 < (int)uVar58) * uVar58 | (uint)(iVar50 >= (int)uVar58) * iVar50;
                      auVar47._0_4_ = iVar28 - gap;
                      auVar47._4_4_ = iVar56 - gap;
                      auVar47._8_4_ = iVar57 - gap;
                      auVar47._12_4_ = iVar45 - gap;
                      auVar61._0_4_ = -(uint)((int)(uVar66 - open) < (int)auVar47._0_4_);
                      auVar61._4_4_ = -(uint)((int)(uVar67 - open) < (int)auVar47._4_4_);
                      auVar61._8_4_ = -(uint)((int)(uVar68 - open) < (int)auVar47._8_4_);
                      auVar61._12_4_ = -(uint)((int)(uVar58 - open) < (int)auVar47._12_4_);
                      iVar27 = movmskps(iVar27,auVar61);
                      alVar55[1] = uVar29 + 1;
                      auVar38 = auVar39;
                      palVar14 = palVar31;
                    } while (iVar27 != 0);
                    bVar35 = uVar29 < uVar23;
                  }
                } while ((!bVar35) &&
                        (bVar35 = uVar65 < 3, auVar38 = auVar39, uVar65 = uVar65 + 1, bVar35));
                alVar55 = ptr_02[uVar32];
                iVar56 = auVar48._0_4_;
                iVar50 = (int)alVar55[0];
                auVar54._0_4_ = -(uint)(iVar56 < iVar50);
                iVar57 = auVar48._4_4_;
                iVar51 = alVar55[0]._4_4_;
                auVar54._4_4_ = -(uint)(iVar57 < iVar51);
                iVar45 = auVar48._8_4_;
                iVar52 = (int)alVar55[1];
                iVar59 = alVar55[1]._4_4_;
                auVar54._8_4_ = -(uint)(iVar45 < iVar52);
                iVar46 = auVar48._12_4_;
                auVar54._12_4_ = -(uint)(iVar46 < iVar59);
                auVar6._4_4_ = -(uint)(uVar18 == 2);
                auVar6._0_4_ = -(uint)(uVar18 == 3);
                auVar6._8_4_ = -(uint)(uVar18 == 1);
                auVar6._12_4_ = -(uint)(uVar18 == 0);
                iVar28 = movmskps(uVar32 * 0x10,auVar54 & auVar6);
                if (iVar28 != 0) {
                  local_dc = (int)uVar21;
                }
                uVar65 = uVar22;
                if (iVar11 < 3) {
                  do {
                    lVar30 = alVar55[1];
                    alVar55[1] = alVar55[0];
                    alVar55[0] = alVar55[1] << 0x20;
                    alVar55[1] = lVar30 << 0x20 | alVar55[1] >> 0x20;
                    uVar65 = uVar65 - 1;
                  } while (uVar65 != 0);
                }
                ((ppVar13->field_4).rowcols)->score_row[uVar21] = (int)(alVar55[1] >> 0x20);
                auVar48._0_4_ = (uint)(iVar50 < iVar56) * iVar56 | (uint)(iVar50 >= iVar56) * iVar50
                ;
                auVar48._4_4_ = (uint)(iVar51 < iVar57) * iVar57 | (uint)(iVar51 >= iVar57) * iVar51
                ;
                auVar48._8_4_ = (uint)(iVar52 < iVar45) * iVar45 | (uint)(iVar52 >= iVar45) * iVar52
                ;
                auVar48._12_4_ =
                     (uint)(iVar59 < iVar46) * iVar46 | (uint)(iVar59 >= iVar46) * iVar59;
                uVar21 = uVar21 + 1;
                palVar14 = ptr_02;
                if (uVar21 == uVar20) {
                  lVar30 = 0;
                  do {
                    puVar3 = (undefined4 *)((long)*ptr_02 + lVar30 * 4);
                    uVar7 = puVar3[1];
                    uVar8 = puVar3[2];
                    uVar9 = puVar3[3];
                    piVar1 = ((ppVar13->field_4).rowcols)->score_col;
                    *(undefined4 *)((long)piVar1 + lVar30) = *puVar3;
                    *(undefined4 *)((long)piVar1 + uVar23 * 4 + lVar30) = uVar7;
                    *(undefined4 *)((long)piVar1 + uVar23 * 8 + lVar30) = uVar8;
                    *(undefined4 *)((long)piVar1 + uVar23 * 0xc + lVar30) = uVar9;
                    lVar30 = lVar30 + 4;
                  } while ((ulong)(uVar15 + (uVar15 == 0)) << 2 != lVar30);
                  uVar22 = uVar33;
                  if ((s2_end != 0) && (uVar22 = auVar48._12_4_, iVar11 < 3)) {
                    uVar65 = 1;
                    if (1 < (int)uVar18) {
                      uVar65 = uVar18;
                    }
                    do {
                      auVar49._0_8_ = auVar48._0_8_ << 0x20;
                      auVar49._8_8_ = auVar48._8_8_ << 0x20 | auVar48._0_8_ >> 0x20;
                      uVar22 = auVar48._8_4_;
                      uVar65 = uVar65 - 1;
                      auVar48 = auVar49;
                    } while (uVar65 != 0);
                  }
                  iVar27 = iVar10;
                  if ((s1_end != 0) && ((uVar26 & 0x7ffffffc) != 0)) {
                    uVar26 = 0;
                    do {
                      iVar24 = ((uint)uVar26 & 3) * uVar15 + ((uint)(uVar26 >> 2) & 0x3fffffff);
                      uVar65 = uVar22;
                      iVar28 = local_dc;
                      iVar56 = iVar27;
                      if ((iVar24 < (int)uVar19) &&
                         (uVar66 = *(uint *)((long)*ptr_02 + uVar26 * 4), uVar65 = uVar66,
                         iVar28 = iVar17, iVar56 = iVar24, (int)uVar66 <= (int)uVar22)) {
                        if (iVar27 <= iVar24) {
                          iVar24 = iVar27;
                        }
                        uVar65 = uVar22;
                        iVar28 = local_dc;
                        iVar56 = iVar27;
                        if (local_dc == iVar17 && uVar66 == uVar22) {
                          iVar56 = iVar24;
                        }
                      }
                      iVar27 = iVar56;
                      local_dc = iVar28;
                      uVar22 = uVar65;
                      uVar26 = uVar26 + 1;
                    } while ((uVar15 & 0x1fffffff) << 2 != (int)uVar26);
                  }
                  uVar19 = s2_end | s1_end;
                  if (uVar19 == 0) {
                    uVar26 = ptr_02[uVar32][0];
                    uVar23 = ptr_02[uVar32][1];
                    if (iVar11 < 3) {
                      uVar15 = 1;
                      if (1 < (int)uVar18) {
                        uVar15 = uVar18;
                      }
                      do {
                        uVar23 = uVar23 << 0x20 | uVar26 >> 0x20;
                        uVar15 = uVar15 - 1;
                        uVar19 = uVar18;
                        uVar26 = uVar26 << 0x20;
                      } while (uVar15 != 0);
                    }
                    uVar22 = (uint)(uVar23 >> 0x20);
                    local_dc = iVar17;
                    iVar27 = iVar10;
                  }
                  auVar37._0_4_ = -(uint)((int)uVar41 < (int)uVar33);
                  auVar37._4_4_ = -(uint)((int)uVar42 < (int)uVar33);
                  auVar37._8_4_ = -(uint)((int)uVar43 < (int)uVar33);
                  auVar37._12_4_ = -(uint)((int)uVar44 < (int)uVar33);
                  auVar40._0_4_ = -(uint)((int)uVar12 < auVar39._0_4_);
                  auVar40._4_4_ = -(uint)((int)uVar12 < auVar39._4_4_);
                  auVar40._8_4_ = -(uint)((int)uVar12 < auVar39._8_4_);
                  auVar40._12_4_ = -(uint)((int)uVar12 < auVar39._12_4_);
                  iVar10 = movmskps(uVar19,auVar40 | auVar37);
                  if (iVar10 != 0) {
                    *(byte *)&ppVar13->flag = (byte)ppVar13->flag | 0x40;
                    uVar22 = 0;
                    local_dc = 0;
                    iVar27 = 0;
                  }
                  ppVar13->score = uVar22;
                  ppVar13->end_query = iVar27;
                  ppVar13->end_ref = local_dc;
                  parasail_free(ptr_01);
                  parasail_free(ptr_00);
                  parasail_free(ptr);
                  parasail_free(ptr_02);
                  return ppVar13;
                }
              } while( true );
            }
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap,
        int s1_beg, int s1_end, int s2_beg, int s2_end)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t k = 0;
    int32_t s1Len = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
    int32_t offset = 0;
    int32_t position = 0;
    __m128i* restrict vProfile = NULL;
    __m128i* restrict pvHStore = NULL;
    __m128i* restrict pvHLoad = NULL;
    __m128i* restrict pvE = NULL;
    int32_t* restrict boundary = NULL;
    __m128i vGapO;
    __m128i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    int32_t score = 0;
    __m128i vNegLimit;
    __m128i vPosLimit;
    __m128i vSaturationCheckMin;
    __m128i vSaturationCheckMax;
    __m128i vMaxH;
    __m128i vPosMask;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    k = 0;
    s1Len = profile->s1Len;
    end_query = s1Len-1;
    end_ref = s2Len-1;
    matrix = profile->matrix;
    segWidth = 4; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
    vProfile = (__m128i*)profile->profile32.score;
    vGapO = _mm_set1_epi32(open);
    vGapE = _mm_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    score = NEG_LIMIT;
    vNegLimit = _mm_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vPosMask = _mm_cmpeq_epi32(_mm_set1_epi32(position),
            _mm_set_epi32(0,1,2,3));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table1(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol1(segLen*segWidth, s2Len);
#else
    result = parasail_result_new();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SG | PARASAIL_FLAG_STRIPED
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_4;
    result->flag |= s1_beg ? PARASAIL_FLAG_SG_S1_BEG : 0;
    result->flag |= s1_end ? PARASAIL_FLAG_SG_S1_END : 0;
    result->flag |= s2_beg ? PARASAIL_FLAG_SG_S2_BEG : 0;
    result->flag |= s2_end ? PARASAIL_FLAG_SG_S2_END : 0;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvHStore = parasail_memalign___m128i(16, segLen);
    pvHLoad =  parasail_memalign___m128i(16, segLen);
    pvE      = parasail_memalign___m128i(16, segLen);
    boundary = parasail_memalign_int32_t(16, s2Len+1);

    /* validate heap variables */
    if (!pvHStore) return NULL;
    if (!pvHLoad) return NULL;
    if (!pvE) return NULL;
    if (!boundary) return NULL;

    /* initialize H and E */
    {
        int32_t index = 0;
        for (i=0; i<segLen; ++i) {
            int32_t segNum = 0;
            __m128i_32_t h;
            __m128i_32_t e;
            for (segNum=0; segNum<segWidth; ++segNum) {
                int64_t tmp = s1_beg ? 0 : (-open-gap*(segNum*segLen+i));
                h.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
                tmp = tmp - open;
                e.v[segNum] = tmp < INT32_MIN ? INT32_MIN : tmp;
            }
            _mm_store_si128(&pvHStore[index], h.m);
            _mm_store_si128(&pvE[index], e.m);
            ++index;
        }
    }

    /* initialize uppder boundary */
    {
        boundary[0] = 0;
        for (i=1; i<=s2Len; ++i) {
            int64_t tmp = s2_beg ? 0 : (-open-gap*(i-1));
            boundary[i] = tmp < INT32_MIN ? INT32_MIN : tmp;
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m128i vE;
        /* Initialize F value to -inf.  Any errors to vH values will be
         * corrected in the Lazy_F loop.  */
        __m128i vF = vNegLimit;

        /* load final segment of pvHStore and shift left by 2 bytes */
        __m128i vH = _mm_slli_si128(pvHStore[segLen - 1], 4);

        /* Correct part of the vProfile */
        const __m128i* vP = vProfile + matrix->mapper[(unsigned char)s2[j]] * segLen;

        /* Swap the 2 H buffers. */
        __m128i* pv = pvHLoad;
        pvHLoad = pvHStore;
        pvHStore = pv;

        /* insert upper boundary condition */
        vH = _mm_insert_epi32(vH, boundary[j], 0);

        /* inner loop to process the query sequence */
        for (i=0; i<segLen; ++i) {
            vH = _mm_add_epi32(vH, _mm_load_si128(vP + i));
            vE = _mm_load_si128(pvE + i);

            /* Get max from vH, vE and vF. */
            vH = _mm_max_epi32(vH, vE);
            vH = _mm_max_epi32(vH, vF);
            /* Save vH values. */
            _mm_store_si128(pvHStore + i, vH);
            vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vE);
            vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vF);
#ifdef PARASAIL_TABLE
            arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif

            /* Update vE value. */
            vH = _mm_sub_epi32(vH, vGapO);
            vE = _mm_sub_epi32(vE, vGapE);
            vE = _mm_max_epi32(vE, vH);
            _mm_store_si128(pvE + i, vE);

            /* Update vF value. */
            vF = _mm_sub_epi32(vF, vGapE);
            vF = _mm_max_epi32(vF, vH);

            /* Load the next vH. */
            vH = _mm_load_si128(pvHLoad + i);
        }

        /* Lazy_F loop: has been revised to disallow adjecent insertion and
         * then deletion, so don't update E(i, i), learn from SWPS3 */
        for (k=0; k<segWidth; ++k) {
            int64_t tmp = s2_beg ? -open : (boundary[j+1]-open);
            int32_t tmp2 = tmp < INT32_MIN ? INT32_MIN : tmp;
            vF = _mm_slli_si128(vF, 4);
            vF = _mm_insert_epi32(vF, tmp2, 0);
            for (i=0; i<segLen; ++i) {
                vH = _mm_load_si128(pvHStore + i);
                vH = _mm_max_epi32(vH,vF);
                _mm_store_si128(pvHStore + i, vH);
                vSaturationCheckMin = _mm_min_epi32(vSaturationCheckMin, vH);
                vSaturationCheckMax = _mm_max_epi32(vSaturationCheckMax, vH);
#ifdef PARASAIL_TABLE
                arr_store_si128(result->tables->score_table, vH, i, segLen, j, s2Len);
#endif
                vH = _mm_sub_epi32(vH, vGapO);
                vF = _mm_sub_epi32(vF, vGapE);
                if (! _mm_movemask_epi8(_mm_cmpgt_epi32(vF, vH))) goto end;
                /*vF = _mm_max_epi32(vF, vH);*/
            }
        }
end:
        {
            /* extract vector containing last value from the column */
            __m128i vCompare;
            vH = _mm_load_si128(pvHStore + offset);
            vCompare = _mm_and_si128(vPosMask, _mm_cmpgt_epi32(vH, vMaxH));
            vMaxH = _mm_max_epi32(vH, vMaxH);
            if (_mm_movemask_epi8(vCompare)) {
                end_ref = j;
            }
#ifdef PARASAIL_ROWCOL
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            result->rowcols->score_row[j] = (int32_t) _mm_extract_epi32 (vH, 3);
#endif
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m128i vH = _mm_load_si128(pvHStore + i);
        arr_store_col(result->rowcols->score_col, vH, i, segLen);
    }
#endif

    /* max last value from all columns */
    if (s2_end)
    {
        for (k=0; k<position; ++k) {
            vMaxH = _mm_slli_si128(vMaxH, 4);
        }
        score = (int32_t) _mm_extract_epi32(vMaxH, 3);
        end_query = s1Len-1;
    }

    /* max of last column */
    if (s1_end)
    {
        /* Trace the alignment ending position on read. */
        int32_t *t = (int32_t*)pvHStore;
        int32_t column_len = segLen * segWidth;
        for (i = 0; i<column_len; ++i, ++t) {
            int32_t temp = i / segWidth + i % segWidth * segLen;
            if (temp >= s1Len) continue;
            if (*t > score) {
                score = *t;
                end_query = temp;
                end_ref = s2Len-1;
            }
            else if (*t == score && end_ref == s2Len-1 && temp < end_query) {
                end_query = temp;
            }
        }
    }

    if (!s1_end && !s2_end) {
        /* extract last value from the last column */
        {
            __m128i vH = _mm_load_si128(pvHStore + offset);
            for (k=0; k<position; ++k) {
                vH = _mm_slli_si128(vH, 4);
            }
            score = (int32_t) _mm_extract_epi32 (vH, 3);
            end_ref = s2Len - 1;
            end_query = s1Len - 1;
        }
    }

    if (_mm_movemask_epi8(_mm_or_si128(
            _mm_cmplt_epi32(vSaturationCheckMin, vNegLimit),
            _mm_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;

    parasail_free(boundary);
    parasail_free(pvE);
    parasail_free(pvHLoad);
    parasail_free(pvHStore);

    return result;
}